

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder> *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    if ((*(char *)((long)pointer + 0x20) == '\x01') &&
       (plVar1 = *(long **)((long)pointer + 0x38), plVar1 != (long *)0x0)) {
      *(undefined8 *)((long)pointer + 0x38) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x30))
                (*(undefined8 **)((long)pointer + 0x30),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)pointer + 0x18);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    operator_delete(pointer,0x50);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }